

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,LogicalType *param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          LogicalType *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3_00;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [40];
  char local_90 [16];
  LogicalType local_80;
  ExceptionFormatValue local_68;
  
  LogicalType::LogicalType(&local_80,(LogicalType *)values);
  ExceptionFormatValue::CreateFormatValue<duckdb::LogicalType>(&local_68,&local_80);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.str_val._M_dataplus._M_p != &local_68.str_val.field_2) {
    operator_delete(local_68.str_val._M_dataplus._M_p);
  }
  LogicalType::~LogicalType(&local_80);
  local_f8._M_allocated_capacity = (size_type)local_e8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_108 + 0x10),*(long *)param,
             (long)&((param->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_ExtraTypeInfo + *(long *)param);
  LogicalType::LogicalType((LogicalType *)local_b8,(LogicalType *)params);
  params_3_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffee8,*(long *)params_1,
             (long)&((params_1->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_ExtraTypeInfo + *(long *)params_1);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,*(long *)params_2._M_dataplus._M_p,
             *(long *)(params_2._M_dataplus._M_p + 8) + *(long *)params_2._M_dataplus._M_p);
  local_b8._24_8_ = local_90;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_b8 + 0x18),*(long *)params_2._M_string_length,
             *(long *)(params_2._M_string_length + 8) + *(long *)params_2._M_string_length);
  ConstructMessageRecursive<std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             (local_108 + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
             (LogicalType *)&stack0xfffffffffffffee8,&local_d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b8 + 0x18),
             params_3_00);
  if ((char *)local_b8._24_8_ != local_90) {
    operator_delete((void *)local_b8._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (params_3_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108)
  {
    operator_delete(params_3_00);
  }
  LogicalType::~LogicalType((LogicalType *)local_b8);
  if ((undefined1 *)local_f8._M_allocated_capacity != local_e8) {
    operator_delete((void *)local_f8._M_allocated_capacity);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}